

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O2

void __thiscall
vkt::memory::anon_unknown_0::RenderFragmentUniformTexelBuffer::~RenderFragmentUniformTexelBuffer
          (RenderFragmentUniformTexelBuffer *this)

{
  pointer pHVar1;
  ulong uVar2;
  
  (this->super_RenderPassCommand)._vptr_RenderPassCommand =
       (_func_int **)&PTR__RenderFragmentUniformTexelBuffer_00c01698;
  pHVar1 = (this->m_bufferViews).
           super__Vector_base<vk::Handle<(vk::HandleType)12>,_std::allocator<vk::Handle<(vk::HandleType)12>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  for (uVar2 = 0;
      uVar2 < (ulong)((long)(this->m_bufferViews).
                            super__Vector_base<vk::Handle<(vk::HandleType)12>,_std::allocator<vk::Handle<(vk::HandleType)12>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pHVar1 >> 3);
      uVar2 = uVar2 + 1) {
    if (pHVar1[uVar2].m_internal != 0) {
      (*this->m_vkd->_vptr_DeviceInterface[0x24])
                (this->m_vkd,this->m_device,pHVar1[uVar2].m_internal,0);
      pHVar1 = (this->m_bufferViews).
               super__Vector_base<vk::Handle<(vk::HandleType)12>,_std::allocator<vk::Handle<(vk::HandleType)12>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pHVar1[uVar2].m_internal = 0;
    }
  }
  std::
  _Vector_base<vk::Handle<(vk::HandleType)12>,_std::allocator<vk::Handle<(vk::HandleType)12>_>_>::
  ~_Vector_base(&(this->m_bufferViews).
                 super__Vector_base<vk::Handle<(vk::HandleType)12>,_std::allocator<vk::Handle<(vk::HandleType)12>_>_>
               );
  std::
  _Vector_base<vk::Handle<(vk::HandleType)22>,_std::allocator<vk::Handle<(vk::HandleType)22>_>_>::
  ~_Vector_base(&(this->m_descriptorSets).
                 super__Vector_base<vk::Handle<(vk::HandleType)22>,_std::allocator<vk::Handle<(vk::HandleType)22>_>_>
               );
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::~RefBase
            (&(this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>);
  PipelineResources::~PipelineResources(&this->m_resources);
  return;
}

Assistant:

RenderFragmentUniformTexelBuffer::~RenderFragmentUniformTexelBuffer (void)
{
	for (size_t bufferViewNdx = 0; bufferViewNdx < m_bufferViews.size(); bufferViewNdx++)
	{
		if (!!m_bufferViews[bufferViewNdx])
		{
			m_vkd->destroyBufferView(m_device, m_bufferViews[bufferViewNdx], DE_NULL);
			m_bufferViews[bufferViewNdx] = (vk::VkBufferView)0;
		}
	}
}